

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

string * __thiscall
llvm::yaml::escape_abi_cxx11_
          (string *__return_storage_ptr__,yaml *this,StringRef Input,bool EscapePrintable)

{
  yaml yVar1;
  char cVar2;
  bool bVar3;
  UTF8Decoded UVar4;
  size_t sVar5;
  char *__lhs;
  uint UCS;
  yaml *pyVar6;
  StringRef Range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined4 local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string HexStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar5 = Input.Length;
  local_94 = (undefined4)Input.Length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pyVar6 = (yaml *)(Input.Data + (long)this);
  do {
    if (this == pyVar6) {
      return __return_storage_ptr__;
    }
    yVar1 = *this;
    switch((llvm *)(ulong)(byte)yVar1) {
    case (llvm *)0x0:
      break;
    case (llvm *)0x1:
    case (llvm *)0x2:
    case (llvm *)0x3:
    case (llvm *)0x4:
    case (llvm *)0x5:
    case (llvm *)0x6:
switchD_0017212b_caseD_1:
      if ((byte)yVar1 < 0x20) {
        utohexstr_abi_cxx11_(&HexStr,(llvm *)(ulong)(byte)yVar1,0,SUB81(sVar5,0));
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_b8,'\x02' - (char)HexStr._M_string_length);
        std::operator+(&local_90,"\\x",&local_b8);
        std::operator+(&local_50,&local_90,&HexStr);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      else if ((char)yVar1 < '\0') {
        Range.Length = (long)pyVar6 - (long)this;
        Range.Data = (char *)this;
        UVar4 = decodeUTF8(Range);
        if ((ulong)UVar4 >> 0x20 == 0) {
          HexStr._M_dataplus._M_p = (pointer)&HexStr.field_2;
          HexStr._M_string_length = 0x400000000;
          encodeUTF8(0xfffd,(SmallVectorImpl<char> *)&HexStr);
          std::__cxx11::string::insert<char*,void>
                    ((string *)__return_storage_ptr__,
                     (const_iterator)
                     ((__return_storage_ptr__->_M_dataplus)._M_p +
                     __return_storage_ptr__->_M_string_length),HexStr._M_dataplus._M_p,
                     HexStr._M_dataplus._M_p + (HexStr._M_string_length & 0xffffffff));
          SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&HexStr);
          return __return_storage_ptr__;
        }
        UCS = UVar4.first;
        if (((UCS == 0x2029) || (UCS == 0xa0)) || ((UCS == 0x2028 || (UCS == 0x85)))) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else if (((char)local_94 == '\0') && (bVar3 = sys::unicode::isPrintable(UCS), bVar3)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)this);
        }
        else {
          utohexstr_abi_cxx11_(&HexStr,(llvm *)((ulong)UVar4 & 0xffffffff),0,SUB81(sVar5,0));
          cVar2 = (char)HexStr._M_string_length;
          if (HexStr._M_string_length < 3) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_b8,'\x02' - cVar2);
            __lhs = "\\x";
LAB_0017236f:
            std::operator+(&local_90,__lhs,&local_b8);
            std::operator+(&local_50,&local_90,&HexStr);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_001723fe:
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
          }
          else {
            if (HexStr._M_string_length < 5) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_b8,'\x04' - cVar2);
              std::operator+(&local_90,"\\u",&local_b8);
              std::operator+(&local_50,&local_90,&HexStr);
              std::__cxx11::string::append((string *)__return_storage_ptr__);
              goto LAB_001723fe;
            }
            if (HexStr._M_string_length < 9) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_b8,'\b' - cVar2);
              __lhs = "\\U";
              goto LAB_0017236f;
            }
          }
          std::__cxx11::string::_M_dispose();
        }
        this = this + (UVar4.second - 1);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      goto LAB_00172268;
    case (llvm *)0x7:
      break;
    case (llvm *)0x8:
      break;
    case (llvm *)0x9:
      break;
    case (llvm *)0xa:
      break;
    case (llvm *)0xb:
      break;
    case (llvm *)0xc:
      break;
    case (llvm *)0xd:
      break;
    default:
      if (((yVar1 != (yaml)0x1b) && (yVar1 != (yaml)0x22)) && (yVar1 != (yaml)0x5c))
      goto switchD_0017212b_caseD_1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00172268:
    this = this + 1;
  } while( true );
}

Assistant:

std::string yaml::escape(StringRef Input, bool EscapePrintable) {
  std::string EscapedInput;
  for (StringRef::iterator i = Input.begin(), e = Input.end(); i != e; ++i) {
    if (*i == '\\')
      EscapedInput += "\\\\";
    else if (*i == '"')
      EscapedInput += "\\\"";
    else if (*i == 0)
      EscapedInput += "\\0";
    else if (*i == 0x07)
      EscapedInput += "\\a";
    else if (*i == 0x08)
      EscapedInput += "\\b";
    else if (*i == 0x09)
      EscapedInput += "\\t";
    else if (*i == 0x0A)
      EscapedInput += "\\n";
    else if (*i == 0x0B)
      EscapedInput += "\\v";
    else if (*i == 0x0C)
      EscapedInput += "\\f";
    else if (*i == 0x0D)
      EscapedInput += "\\r";
    else if (*i == 0x1B)
      EscapedInput += "\\e";
    else if ((unsigned char)*i < 0x20) { // Control characters not handled above.
      std::string HexStr = utohexstr(*i);
      EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
    } else if (*i & 0x80) { // UTF-8 multiple code unit subsequence.
      UTF8Decoded UnicodeScalarValue
        = decodeUTF8(StringRef(i, Input.end() - i));
      if (UnicodeScalarValue.second == 0) {
        // Found invalid char.
        SmallString<4> Val;
        encodeUTF8(0xFFFD, Val);
        EscapedInput.insert(EscapedInput.end(), Val.begin(), Val.end());
        // FIXME: Error reporting.
        return EscapedInput;
      }
      if (UnicodeScalarValue.first == 0x85)
        EscapedInput += "\\N";
      else if (UnicodeScalarValue.first == 0xA0)
        EscapedInput += "\\_";
      else if (UnicodeScalarValue.first == 0x2028)
        EscapedInput += "\\L";
      else if (UnicodeScalarValue.first == 0x2029)
        EscapedInput += "\\P";
      else if (!EscapePrintable &&
               sys::unicode::isPrintable(UnicodeScalarValue.first))
        EscapedInput += StringRef(i, UnicodeScalarValue.second);
      else {
        std::string HexStr = utohexstr(UnicodeScalarValue.first);
        if (HexStr.size() <= 2)
          EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 4)
          EscapedInput += "\\u" + std::string(4 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 8)
          EscapedInput += "\\U" + std::string(8 - HexStr.size(), '0') + HexStr;
      }
      i += UnicodeScalarValue.second - 1;
    } else
      EscapedInput.push_back(*i);
  }
  return EscapedInput;
}